

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O2

void VP8LInverseTransform
               (VP8LTransform *transform,int row_start,int row_end,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t *puVar3;
  ulong uVar4;
  uint32_t *puVar5;
  byte bVar6;
  uint uVar7;
  long lVar8;
  uint32_t *puVar9;
  uint *puVar10;
  uint uVar11;
  undefined4 in_register_00000034;
  ulong uVar12;
  int num_pixels;
  uint uVar13;
  ulong uVar14;
  VP8LMultipliers local_90;
  int local_8c;
  uint32_t *local_88;
  uint local_7c;
  uint32_t *local_78;
  uint local_6c;
  ulong local_68;
  VP8LTransform *local_60;
  long local_58;
  uint *local_50;
  uint32_t *local_48;
  uint32_t *local_40;
  long local_38;
  
  puVar5 = (uint32_t *)CONCAT44(in_register_00000034,row_start);
  if (transform->type_ < 4) {
    uVar7 = transform->xsize_;
    uVar12 = (ulong)(int)uVar7;
    local_8c = row_end;
    local_88 = out;
    local_7c = row_start;
    local_68 = uVar12;
    switch(transform->type_) {
    case PREDICTOR_TRANSFORM:
      if (row_start == 0) {
        PredictorAdd0_C(in,puVar5,1,out);
        uVar12 = local_68;
        num_pixels = (int)local_68 + -1;
        PredictorAdd1_C(in + 1,puVar5,num_pixels,out + 1);
        row_start = 1;
        in = in + uVar12;
        out = out + uVar12;
      }
      else {
        num_pixels = uVar7 - 1;
      }
      bVar6 = (byte)transform->bits_;
      uVar7 = 1 << (bVar6 & 0x1f);
      local_40 = (uint32_t *)(ulong)uVar7;
      local_6c = num_pixels + uVar7 >> (bVar6 & 0x1f);
      local_58 = CONCAT44(local_58._4_4_,uVar7 - 1);
      puVar10 = transform->data_ + (int)((row_start >> (bVar6 & 0x1f)) * local_6c);
      local_78 = out;
      local_60 = transform;
      while (row_start < local_8c) {
        local_48 = (uint32_t *)CONCAT44(local_48._4_4_,row_start);
        PredictorAdd2_C(in,local_78 + -uVar12,1,local_78);
        uVar4 = local_68;
        uVar14 = 1;
        local_50 = puVar10;
        while( true ) {
          uVar11 = (uint)uVar14;
          if ((int)uVar4 <= (int)uVar11) break;
          uVar2 = *puVar10;
          puVar10 = puVar10 + 1;
          uVar13 = (uVar11 & -uVar7) + (int)local_40;
          uVar14 = (ulong)uVar13;
          if ((int)uVar4 <= (int)uVar13) {
            uVar14 = uVar4 & 0xffffffff;
          }
          (**(code **)((long)VP8LPredictorsAdd + (ulong)(uVar2 >> 5 & 0x78)))
                    (in + (int)uVar11,local_78 + ((long)(int)uVar11 - uVar12),(int)uVar14 - uVar11);
        }
        in = in + uVar4;
        local_78 = local_78 + uVar4;
        row_start = (int)local_48 + 1;
        uVar11 = 0;
        if (((uint)local_58 & row_start) == 0) {
          uVar11 = local_6c;
        }
        puVar10 = local_50 + (int)uVar11;
      }
      if (local_60->ysize_ != local_8c) {
        memcpy(local_88 + -local_68,local_88 + (int)((~local_7c + local_8c) * (int)local_68),
               local_68 * 4);
        return;
      }
      break;
    case CROSS_COLOR_TRANSFORM:
      bVar6 = (byte)transform->bits_;
      uVar11 = 1 << (bVar6 & 0x1f);
      local_78 = (uint32_t *)(ulong)uVar11;
      local_50 = (uint *)CONCAT44(local_50._4_4_,uVar11 - 1);
      local_6c = (uVar11 + uVar7) - 1 >> (bVar6 & 0x1f);
      puVar5 = transform->data_ + (int)((row_start >> (bVar6 & 0x1f)) * local_6c);
      local_60 = (VP8LTransform *)CONCAT44(local_60._4_4_,uVar7 - (-uVar11 & uVar7));
      local_58 = (long)(int)(-uVar11 & uVar7);
      local_38 = uVar12 * 4 + local_58 * -4;
      while ((int)local_7c < local_8c) {
        puVar9 = in + local_58;
        local_48 = puVar5;
        local_40 = in;
        for (; puVar3 = local_88, in < puVar9; in = in + (int)uVar11) {
          uVar1 = *puVar5;
          puVar5 = puVar5 + 1;
          local_90._0_2_ = SUB42(uVar1,0);
          local_90.red_to_blue_ = (uint8_t)(uVar1 >> 0x10);
          (*VP8LTransformColorInverse)(&local_90,in,(int)local_78,local_88);
          local_88 = puVar3 + (int)uVar11;
        }
        if (in < local_40 + local_68) {
          local_90._0_2_ = SUB42(*puVar5,0);
          local_90.red_to_blue_ = (uint8_t)(*puVar5 >> 0x10);
          (*VP8LTransformColorInverse)(&local_90,in,(int)local_60,local_88);
          in = (uint32_t *)((long)in + local_38);
          local_88 = (uint32_t *)((long)puVar3 + local_38);
        }
        local_7c = local_7c + 1;
        uVar7 = 0;
        if (((uint)local_50 & local_7c) == 0) {
          uVar7 = local_6c;
        }
        puVar5 = local_48 + (int)uVar7;
      }
      break;
    case SUBTRACT_GREEN_TRANSFORM:
      (*VP8LAddGreenToBlueAndRed)(in,(row_end - row_start) * uVar7,out);
      return;
    case COLOR_INDEXING_TRANSFORM:
      if ((in == out) && (0 < transform->bits_)) {
        bVar6 = (byte)transform->bits_;
        lVar8 = (long)(int)((((1 << (bVar6 & 0x1f)) + uVar7) - 1 >> (bVar6 & 0x1f)) *
                           (row_end - row_start));
        in = out + ((int)(uVar7 * (row_end - row_start)) - lVar8);
        memmove(in,out,lVar8 * 4);
      }
      ColorIndexInverseTransform_C(transform,row_start,row_end,in,out);
      return;
    }
  }
  return;
}

Assistant:

void VP8LInverseTransform(const VP8LTransform* const transform,
                          int row_start, int row_end,
                          const uint32_t* const in, uint32_t* const out) {
  const int width = transform->xsize_;
  assert(row_start < row_end);
  assert(row_end <= transform->ysize_);
  switch (transform->type_) {
    case SUBTRACT_GREEN_TRANSFORM:
      VP8LAddGreenToBlueAndRed(in, (row_end - row_start) * width, out);
      break;
    case PREDICTOR_TRANSFORM:
      PredictorInverseTransform_C(transform, row_start, row_end, in, out);
      if (row_end != transform->ysize_) {
        // The last predicted row in this iteration will be the top-pred row
        // for the first row in next iteration.
        memcpy(out - width, out + (row_end - row_start - 1) * width,
               width * sizeof(*out));
      }
      break;
    case CROSS_COLOR_TRANSFORM:
      ColorSpaceInverseTransform_C(transform, row_start, row_end, in, out);
      break;
    case COLOR_INDEXING_TRANSFORM:
      if (in == out && transform->bits_ > 0) {
        // Move packed pixels to the end of unpacked region, so that unpacking
        // can occur seamlessly.
        // Also, note that this is the only transform that applies on
        // the effective width of VP8LSubSampleSize(xsize_, bits_). All other
        // transforms work on effective width of xsize_.
        const int out_stride = (row_end - row_start) * width;
        const int in_stride = (row_end - row_start) *
            VP8LSubSampleSize(transform->xsize_, transform->bits_);
        uint32_t* const src = out + out_stride - in_stride;
        memmove(src, out, in_stride * sizeof(*src));
        ColorIndexInverseTransform_C(transform, row_start, row_end, src, out);
      } else {
        ColorIndexInverseTransform_C(transform, row_start, row_end, in, out);
      }
      break;
  }
}